

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[10],kj::String,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [10],String *params_1,
          char *params_2)

{
  char (*value) [10];
  String *value_00;
  char *value_01;
  char local_49 [1];
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  String *local_28;
  char *params_local_2;
  String *params_local_1;
  char (*params_local) [10];
  
  local_28 = params_1;
  params_local_2 = *params;
  params_local_1 = (String *)this;
  params_local = (char (*) [10])__return_storage_ptr__;
  value = ::const((char (*) [10])this);
  local_38 = toCharSequence<char_const(&)[10]>(value);
  value_00 = fwd<kj::String>((NoInfer<kj::String> *)params_local_2);
  local_48 = toCharSequence<kj::String>(value_00);
  value_01 = fwd<char>((NoInfer<char> *)local_28);
  local_49[0] = (char)toCharSequence<char>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_38,&local_48,(ArrayPtr<const_char> *)local_49,
             (FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}